

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxyd.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  __pid_t _Var7;
  int iVar8;
  size_t sVar9;
  int *piVar10;
  ulong uVar11;
  char *pcVar12;
  FILE *__stream;
  uint __errnum;
  undefined8 uVar13;
  char *pcVar14;
  bool bVar15;
  size_t sStack_100;
  char *local_e8;
  sigaction sigact;
  
  local_e8 = (char *)0x0;
  memset(&sigact,0,0x98);
  ph.priv = (void *)0x0;
  ph.conf.bind_addr = (char *)0x0;
  ph.conf.bind_addr_ext = (char *)0x0;
  ph.conf.bind_addr_ext_add = (char **)0x0;
  ph.conf.calls_allowed = (char *)0x0;
  ph.conf.calls_denied = (char *)0x0;
  ph.conf.connection_timeout = 0;
  ph.conf.bind_addr_ext_add_len = 0;
  ph.conf.port = 0;
  ph.conf.password = (char *)0x0;
  ph.conf.reg_name = (char *)0x0;
  ph.conf.reg_comment = (char *)0x0;
  ph.conf.public_addr = (char *)0x0;
  bVar3 = false;
  pcVar14 = (char *)0x0;
  bVar5 = false;
  bVar2 = false;
  bVar4 = false;
  for (iVar8 = 1; iVar8 < argc; iVar8 = iVar8 + 1) {
    pcVar12 = argv[iVar8];
    sVar9 = strlen(pcVar12);
    if (sVar9 < 2) {
      if (sVar9 == 0) {
LAB_00101a17:
        fprintf(_stderr,"ERROR: Invalid option \'%s\'\n",pcVar12);
        goto LAB_001019e9;
      }
LAB_001013e5:
      bVar15 = pcVar14 != (char *)0x0;
      pcVar14 = pcVar12;
      if (bVar15) {
        pcVar14 = "ERROR: Config path already specified\n";
        sStack_100 = 0x25;
LAB_001019e0:
        fwrite(pcVar14,sStack_100,1,_stderr);
LAB_001019e9:
        exit(-0x16);
      }
    }
    else {
      if (*pcVar12 != '-') goto LAB_001013e5;
      if (pcVar12[1] == '-') {
        __s1 = pcVar12 + 2;
        iVar6 = strcmp(__s1,"debug");
        if (iVar6 == 0) {
          bVar3 = true;
        }
        else {
          iVar6 = strcmp(__s1,"help");
          if (iVar6 == 0) {
LAB_0010197c:
            print_usage();
            goto LAB_00101a10;
          }
          iVar6 = strcmp(__s1,"quiet");
          bVar4 = true;
          if (iVar6 != 0) {
            iVar8 = strcmp(__s1,"version");
            if (iVar8 != 0) goto LAB_00101a17;
LAB_00101a04:
            puts("0.9.4-dev");
            goto LAB_00101a10;
          }
        }
      }
      else {
        for (uVar11 = 1; uVar11 < sVar9; uVar11 = uVar11 + 1) {
          cVar1 = argv[iVar8][uVar11];
          if (cVar1 == 'F') {
            bVar5 = true;
          }
          else if (cVar1 == 'L') {
            if (bVar2) {
LAB_00101986:
              pcVar14 = "ERROR: Only one logging mechanism is allowed\n";
              sStack_100 = 0x2d;
              goto LAB_001019e0;
            }
            if (uVar11 + 1 < sVar9) {
              local_e8 = argv[iVar8] + uVar11 + 1;
              bVar2 = false;
              uVar11 = sVar9;
            }
            else {
              iVar8 = iVar8 + 1;
              if (argc <= iVar8) {
                pcVar14 = "ERROR: Invalid log file path\n";
                sStack_100 = 0x1d;
                goto LAB_001019e0;
              }
              local_e8 = argv[iVar8];
              bVar2 = false;
            }
          }
          else if (cVar1 == 'S') {
            if (local_e8 != (char *)0x0) goto LAB_00101986;
            bVar2 = true;
            local_e8 = (char *)0x0;
          }
          else if (cVar1 == 'd') {
            bVar3 = true;
          }
          else {
            if (cVar1 != 'q') {
              if (cVar1 == 'V') goto LAB_00101a04;
              if (cVar1 == 'h') goto LAB_0010197c;
              fprintf(_stderr,"ERROR: Invalid flag \'%c\'\n",(ulong)(uint)(int)cVar1);
              goto LAB_001019e9;
            }
            bVar4 = true;
          }
        }
      }
    }
  }
  if (pcVar14 == (char *)0x0) {
    iVar8 = access("ELProxy.conf",4);
    pcVar14 = "../etc/ELProxy.conf";
    if (iVar8 == 0) {
      pcVar14 = "ELProxy.conf";
    }
  }
  sigact.__sigaction_handler.sa_handler = graceful_shutdown;
  sigact.sa_flags = 4;
  sigaction(2,(sigaction *)&sigact,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&sigact,(sigaction *)0x0);
  sigaction(10,(sigaction *)&sigact,(sigaction *)0x0);
  iVar8 = proxy_init(&ph);
  __stream = _stderr;
  if (iVar8 < 0) {
    __errnum = -iVar8;
    pcVar14 = strerror(__errnum);
    pcVar12 = "Failed to initialize proxy (%d): %s\n";
  }
  else {
    iVar8 = 2;
    if (!bVar4) {
      iVar8 = 4 - (uint)!bVar3;
    }
    proxy_log_level(&ph,iVar8);
    iVar8 = proxy_log_select_medium(&ph,1,0);
    __stream = _stderr;
    if (-1 < iVar8) {
      iVar8 = proxy_load_conf(&ph,pcVar14);
      if (iVar8 < 0) {
        pcVar12 = strerror(-iVar8);
        proxy_log(&ph,0,"Failed to load config from \'%s\' (%d): %s\n",pcVar14,-iVar8,pcVar12);
        goto LAB_001018fa;
      }
      iVar8 = proxy_open();
      if (iVar8 < 0) {
        iVar6 = -iVar8;
        pcVar14 = strerror(iVar6);
        pcVar12 = "Failed to open proxy (%d): %s\n";
LAB_001018ec:
        proxy_log(&ph,0,pcVar12,iVar6,pcVar14);
      }
      else {
        if (bVar5) {
          if (local_e8 == (char *)0x0) {
            if (bVar2) {
              proxy_log(&ph,3,"Switching log to syslog\n");
              iVar8 = proxy_log_select_medium(&ph,3,0);
              if (iVar8 != 0) {
                iVar8 = -iVar8;
                pcVar14 = strerror(iVar8);
                pcVar12 = "Failed to activate syslog (%d): %s\n";
                goto LAB_001016ed;
              }
            }
          }
          else {
            proxy_log(&ph,3,"Switching log to file \"%s\"\n",local_e8);
            iVar8 = proxy_log_select_medium(&ph,2,local_e8);
            if (iVar8 != 0) {
              iVar8 = -iVar8;
              pcVar14 = strerror(iVar8);
              pcVar12 = "Failed to open log file (%d): %s\n";
LAB_001016ed:
              proxy_log(&ph,1,pcVar12,iVar8,pcVar14);
            }
          }
LAB_00101802:
          iVar8 = proxy_start(&ph);
          if (iVar8 < 0) {
            iVar6 = -iVar8;
            pcVar14 = strerror(iVar6);
            pcVar12 = "Failed to start proxy (%d): %s\n";
            goto LAB_001018ec;
          }
          proxy_log(&ph,3,"Ready.\n");
          while ((iVar8 == 0 && ((sentinel & 1) == 0))) {
            proxy_log(&ph,4,"Starting a processing run...\n");
            iVar8 = proxy_process(&ph);
            if (iVar8 < 0) {
              if (iVar8 == -4) {
                while (sentinel == 0) {
                  usleep(50000);
                }
                iVar8 = 0;
              }
              else {
                pcVar14 = strerror(-iVar8);
                proxy_log(&ph,0,"Message processing failure (%d): %s\n",-iVar8,pcVar14);
              }
            }
          }
          pcVar14 = "Shutting down...\n";
          uVar13 = 3;
        }
        else {
          iVar8 = fork();
          if (-1 < iVar8) {
            if (iVar8 != 0) {
LAB_00101a10:
              exit(0);
            }
            if (local_e8 == (char *)0x0) {
              if (bVar2) {
                iVar8 = proxy_log_select_medium(&ph,3,0);
                if (iVar8 != 0) {
                  pcVar14 = "Failed to activate syslog (%d): %s\n";
                  goto LAB_00101792;
                }
                goto LAB_001017b4;
              }
            }
            else {
              iVar8 = proxy_log_select_medium(&ph,2);
              if (iVar8 != 0) {
                pcVar14 = "Failed to open log file (%d): %s\n";
LAB_00101792:
                pcVar12 = strerror(-iVar8);
                proxy_log(&ph,1,pcVar14,-iVar8,pcVar12);
              }
LAB_001017b4:
              proxy_log_level(&ph,4 - (uint)!bVar3);
            }
            umask(0);
            _Var7 = setsid();
            if (_Var7 < 0) {
              piVar10 = __errno_location();
              iVar8 = *piVar10;
              pcVar14 = strerror(iVar8);
              pcVar12 = "Process error (%d): %s\n";
            }
            else {
              iVar8 = chdir("/");
              if (-1 < iVar8) {
                close(0);
                close(1);
                close(2);
                goto LAB_00101802;
              }
              piVar10 = __errno_location();
              iVar8 = *piVar10;
              pcVar14 = strerror(iVar8);
              pcVar12 = "Failed to change dir (%d): %s\n";
            }
            proxy_log(&ph,0,pcVar12,iVar8,pcVar14);
            iVar8 = *piVar10;
            goto LAB_001018fa;
          }
          pcVar14 = "Error forking daemon process\n";
          uVar13 = 0;
        }
        proxy_log(&ph,uVar13,pcVar14);
      }
      goto LAB_001018fa;
    }
    __errnum = -iVar8;
    pcVar14 = strerror(__errnum);
    pcVar12 = "Failed to switch log to STDOUT (%d): %s\n";
  }
  fprintf(__stream,pcVar12,(ulong)__errnum,pcVar14);
LAB_001018fa:
  proxy_free(&ph);
  return iVar8;
}

Assistant:

int main(int argc, const char * const argv[])
{
	struct proxy_opts opts;

#ifndef _WIN32
	struct sigaction sigact;
#endif
	int ret;

	memset(&opts, 0x0, sizeof(opts));
#ifndef _WIN32
	memset(&sigact, 0x0, sizeof(sigact));
#endif
	memset(&ph, 0x0, sizeof(ph));

	parse_args(argc, argv, &opts);
	if (opts.config_path == NULL) {
#ifdef OPENELP_CONFIG_HINT
		opts.config_path = proxy_config_hint();
#else
		opts.config_path = config_path_default;
#endif
	}

#ifndef _WIN32
	/* Handle SIGINT/SIGTERM */
	sigact.sa_sigaction = graceful_shutdown;
	sigact.sa_flags |= SA_SIGINFO;

	sigaction(SIGINT, &sigact, NULL);
	sigaction(SIGTERM, &sigact, NULL);
	sigaction(SIGUSR1, &sigact, NULL);
#else
	if (!SetConsoleCtrlHandler(graceful_shutdown, TRUE))
		fprintf(stderr, "Failed to set signal handler (%d)\n",
			GetLastError());

#endif

	/* Initialize proxy */
	ret = proxy_init(&ph);
	if (ret < 0) {
		fprintf(stderr, "Failed to initialize proxy (%d): %s\n", -ret,
			strerror(-ret));
		goto proxyd_exit;
	}

	/* Set the initial logging level */
	proxy_log_level(&ph, opts.quiet ? LOG_LEVEL_WARN : opts.debug ?
			LOG_LEVEL_DEBUG : LOG_LEVEL_INFO);

	/* Open the log */
	ret = proxy_log_select_medium(&ph, LOG_MEDIUM_STDOUT, NULL);
	if (ret < 0) {
		fprintf(stderr, "Failed to switch log to STDOUT (%d): %s\n",
			-ret, strerror(-ret));
		goto proxyd_exit;
	}

	/* Load the config */
	ret = proxy_load_conf(&ph, opts.config_path);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to load config from '%s' (%d): %s\n",
			  opts.config_path, -ret, strerror(-ret));
		goto proxyd_exit;
	}

	/* Start listening */
	ret = proxy_open(&ph);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to open proxy (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxyd_exit;
	}

#ifndef _WIN32
	/* Daemonize */
	if (!opts.foreground) {
		pid_t pid;
		pid_t sid;

		pid = fork();

		if (pid < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Error forking daemon process\n");
			ret = pid;
			goto proxyd_exit;
		}

		if (pid > 0)
			exit(0);

		/*! @TODO Double-fork */

		if (opts.log_path) {
			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_FILE,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to open log file (%d): %s\n",
					  -ret, strerror(-ret));
			proxy_log_level(&ph, opts.debug ? LOG_LEVEL_DEBUG :
					LOG_LEVEL_INFO);
		} else if (opts.syslog) {
			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_SYSLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate syslog (%d): %s\n",
					  -ret, strerror(-ret));
			proxy_log_level(&ph, opts.debug ? LOG_LEVEL_DEBUG :
					LOG_LEVEL_INFO);
		}

		umask(0);

		sid = setsid();
		if (sid < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Process error (%d): %s\n",
				  errno, strerror(errno));
			ret = errno;
			goto proxyd_exit;
		}

		if (chdir("/") < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Failed to change dir (%d): %s\n",
				  errno, strerror(errno));
			ret = errno;
			goto proxyd_exit;
		}

		close(STDIN_FILENO);
		close(STDOUT_FILENO);
		close(STDERR_FILENO);
	} else
#endif
	{
		/* Switch log, if necessary */
		if (opts.log_path) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to file \"%s\"\n",
				  opts.log_path);

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_FILE,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to open log file (%d): %s\n",
					  -ret, strerror(-ret));
		} else if (opts.syslog) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to syslog\n");

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_SYSLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate syslog (%d): %s\n",
					  -ret, strerror(-ret));
		} else if (opts.eventlog) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to eventlog\n");

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_EVENTLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate eventlog (%d): %s\n",
					  -ret, strerror(-ret));
		}
	}

	ret = proxy_start(&ph);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to start proxy (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxyd_exit;
	}

	proxy_log(&ph, LOG_LEVEL_INFO, "Ready.\n");

	/* Main dispatch loop */
	while (ret == 0 && sentinel == 0) {
		proxy_log(&ph, LOG_LEVEL_DEBUG,
			  "Starting a processing run...\n");
		ret = proxy_process(&ph);
		if (ret < 0) {
			switch (ret) {
			case -EINTR:
				ret = 0;

				/*! @TODO Something better than a busy loop */
				while (!sentinel) {
#ifdef _WIN32
					Sleep(50);
#else
					usleep(50000);
#endif
				}

				break;
			default:
				proxy_log(&ph, LOG_LEVEL_FATAL,
					  "Message processing failure (%d): %s\n",
					  -ret, strerror(-ret));
				break;
			}
		}
	}

	proxy_log(&ph, LOG_LEVEL_INFO, "Shutting down...\n");

proxyd_exit:
	proxy_free(&ph);

#ifdef _WIN32
	if (ret != 0) {
		HWND console_window = GetConsoleWindow();

		if (console_window != NULL) {
			DWORD process_id;

			GetWindowThreadProcessId(console_window, &process_id);
			if (GetCurrentProcessId() == process_id) {
				printf("Press any key to exit . . . ");
				_getch();
			}
		}
	}
#endif

	return ret;
}